

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveCreate(Parser *parser,int flags)

{
  bool bVar1;
  reference pvVar2;
  pointer this;
  undefined4 in_register_00000034;
  path local_98;
  unique_ptr<CDirectiveFile,_std::default_delete<CDirectiveFile>_> local_78;
  __single_object file;
  StringLiteral inputName;
  int64_t memoryAddress;
  undefined1 local_38 [8];
  vector<Expression,_std::allocator<Expression>_> list;
  int flags_local;
  Parser *parser_local;
  
  std::vector<Expression,_std::allocator<Expression>_>::vector
            ((vector<Expression,_std::allocator<Expression>_> *)local_38);
  bVar1 = Parser::parseExpressionList
                    ((Parser *)CONCAT44(in_register_00000034,flags),
                     (vector<Expression,_std::allocator<Expression>_> *)local_38,2,2);
  if (bVar1) {
    StringLiteral::StringLiteral((StringLiteral *)&file);
    pvVar2 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                       ((vector<Expression,_std::allocator<Expression>_> *)local_38,0);
    bVar1 = Expression::evaluateString(pvVar2,(StringLiteral *)&file,false);
    if (bVar1) {
      pvVar2 = std::vector<Expression,_std::allocator<Expression>_>::back
                         ((vector<Expression,_std::allocator<Expression>_> *)local_38);
      bVar1 = Expression::evaluateInteger<long>
                        (pvVar2,(long *)(inputName._value.field_2._M_local_buf + 8));
      if (bVar1) {
        std::make_unique<CDirectiveFile>();
        this = std::unique_ptr<CDirectiveFile,_std::default_delete<CDirectiveFile>_>::operator->
                         (&local_78);
        StringLiteral::path(&local_98,(StringLiteral *)&file);
        CDirectiveFile::initCreate(this,&local_98,inputName._value.field_2._8_8_);
        ghc::filesystem::path::~path(&local_98);
        std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
        unique_ptr<CDirectiveFile,std::default_delete<CDirectiveFile>,void>
                  ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                   &local_78);
        std::unique_ptr<CDirectiveFile,_std::default_delete<CDirectiveFile>_>::~unique_ptr
                  (&local_78);
      }
      else {
        std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
        unique_ptr<std::default_delete<CAssemblerCommand>,void>
                  ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                   (nullptr_t)0x0);
      }
    }
    else {
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<std::default_delete<CAssemblerCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 (nullptr_t)0x0);
    }
    StringLiteral::~StringLiteral((StringLiteral *)&file);
  }
  else {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (nullptr_t)0x0);
  }
  std::vector<Expression,_std::allocator<Expression>_>::~vector
            ((vector<Expression,_std::allocator<Expression>_> *)local_38);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveCreate(Parser& parser, int flags)
{
	std::vector<Expression> list;
	if (!parser.parseExpressionList(list,2,2))
		return nullptr;

	int64_t memoryAddress;
	StringLiteral inputName;

	if (!list[0].evaluateString(inputName,false))
		return nullptr;

	if (!list.back().evaluateInteger(memoryAddress))
		return nullptr;

	auto file = std::make_unique<CDirectiveFile>();
	file->initCreate(inputName.path(),memoryAddress);
	return file;
}